

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_loop.c
# Opt level: O0

void apx_eventLoop_run(apx_eventLoop_t *self,apx_eventHandlerFunc_t *eventHandler,
                      void *eventHandlerArg)

{
  int iVar1;
  undefined1 local_58 [4];
  int result;
  apx_event_t event;
  _Bool exitFlag;
  void *eventHandlerArg_local;
  apx_eventHandlerFunc_t *eventHandler_local;
  apx_eventLoop_t *self_local;
  
  event.evData5._3_1_ = 0;
  while ((event.evData5._3_1_ & 1) == 0) {
    iVar1 = sem_wait((sem_t *)&self->semaphore);
    if (iVar1 == 0) {
      pthread_spin_lock(&self->lock);
      event.evData5._3_1_ = self->exitFlag & 1;
      if (event.evData5._3_1_ == 0) {
        adt_rbfh_remove(&self->pendingEvents,local_58);
      }
      pthread_spin_unlock(&self->lock);
      if ((event.evData5._3_1_ & 1) == 0) {
        apx_eventLoop_processEvent(self,(apx_event_t *)local_58,eventHandler,eventHandlerArg);
      }
    }
  }
  return;
}

Assistant:

void apx_eventLoop_run(apx_eventLoop_t *self, apx_eventHandlerFunc_t *eventHandler, void *eventHandlerArg)
{
   bool exitFlag = false;
   while(exitFlag == false)
   {
      apx_event_t event;
#ifdef _MSC_VER
      DWORD result = WaitForSingleObject(self->semaphore, INFINITE);
      if (result == WAIT_OBJECT_0)
#else
      int result = sem_wait(&self->semaphore);
      if (result == 0)
#endif
      {
         SPINLOCK_ENTER(self->lock);
         exitFlag = self->exitFlag;
         if (exitFlag == false)
         {
            adt_rbfh_remove(&self->pendingEvents,(uint8_t*) &event);
         }
         SPINLOCK_LEAVE(self->lock);
         if (exitFlag == false)
         {
            apx_eventLoop_processEvent(self, &event, eventHandler, eventHandlerArg);
         }
      }
   }
}